

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          CodedInputStream *input,FieldSkipper *field_skipper)

{
  bool bVar1;
  Limit LVar2;
  int iVar3;
  ulong uVar4;
  CodedInputStream *pCVar5;
  MessageLite *value_32;
  byte *in_RCX;
  byte in_DL;
  undefined4 in_ESI;
  ExtensionSet *in_R8;
  long *in_R9;
  MessageLite *value_31;
  MessageLite *value_30;
  string *value_29;
  string *value_28;
  int value_27;
  bool value_26;
  double value_25;
  float value_24;
  int64 value_23;
  int32 value_22;
  uint64 value_21;
  uint32 value_20;
  int64 value_19;
  int32 value_18;
  uint64 value_17;
  uint32 value_16;
  int64 value_15;
  int32 value_14;
  int value_13;
  bool value_12;
  double value_11;
  float value_10;
  int64 value_9;
  int32 value_8;
  uint64 value_7;
  uint32 value_6;
  int64 value_5;
  int32 value_4;
  uint64 value_3;
  uint32 value_2;
  int64 value_1;
  int32 value;
  Limit limit;
  uint32 size;
  uint32 temp_10;
  uint32 temp;
  uint64 temp_11;
  uint64 temp_1;
  uint32 temp_12;
  uint32 temp_2;
  uint64 temp_13;
  uint64 temp_3;
  uint32 temp_14;
  uint32 temp_4;
  uint64 temp_15;
  uint64 temp_5;
  uint32 temp_16;
  uint32 temp_6;
  uint64 temp_17;
  uint64 temp_7;
  uint64 temp_18;
  uint64 temp_8;
  uint32 temp_19;
  uint32 temp_9;
  LogMessage *in_stack_fffffffffffffb88;
  CodedInputStream *in_stack_fffffffffffffb90;
  CodedInputStream *in_stack_fffffffffffffb98;
  CodedInputStream *in_stack_fffffffffffffba0;
  CodedInputStream *in_stack_fffffffffffffba8;
  uint64 *in_stack_fffffffffffffbb0;
  CodedInputStream *in_stack_fffffffffffffbb8;
  FieldDescriptor *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  float in_stack_fffffffffffffc94;
  undefined2 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9a;
  FieldType in_stack_fffffffffffffc9b;
  int in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 uVar6;
  FieldType type;
  int in_stack_fffffffffffffca4;
  ExtensionSet *in_stack_fffffffffffffca8;
  FieldDescriptor *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  FieldType type_00;
  int in_stack_fffffffffffffcbc;
  undefined4 in_stack_fffffffffffffcc0;
  FieldType type_01;
  int in_stack_fffffffffffffcc4;
  ExtensionSet *in_stack_fffffffffffffcc8;
  FieldType in_stack_fffffffffffffcd3;
  int in_stack_fffffffffffffcd4;
  ExtensionSet *in_stack_fffffffffffffcd8;
  FieldDescriptor *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  float in_stack_fffffffffffffd0c;
  undefined4 local_2ac;
  uint32 local_20c;
  uint32 local_1f4;
  uint64 local_1d8;
  uint64 local_1b8;
  uint32 local_e4;
  uint32 local_cc;
  uint64 local_b0;
  uint64 local_90;
  undefined4 local_34;
  undefined4 local_1c;
  
  if ((in_DL & 1) == 0) {
    pCVar5 = (CodedInputStream *)(ulong)(*in_RCX - 1);
    type_01 = (FieldType)((uint)in_stack_fffffffffffffcc0 >> 0x18);
    type_00 = (FieldType)((uint)in_stack_fffffffffffffcb8 >> 0x18);
    type = (FieldType)((uint)in_stack_fffffffffffffca0 >> 0x18);
    switch(pCVar5) {
    case (CodedInputStream *)0x0:
      bVar1 = io::CodedInputStream::ReadLittleEndian64
                        (in_stack_fffffffffffffb98,(uint64 *)in_stack_fffffffffffffb90);
      if (!bVar1) {
        return false;
      }
      WireFormatLite::DecodeDouble(local_b0);
      if ((in_RCX[1] & 1) == 0) {
        SetDouble((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                  in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                  (double)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                  in_stack_fffffffffffffc88);
      }
      else {
        AddDouble(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),
                  (double)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                  in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0x1:
      bVar1 = io::CodedInputStream::ReadLittleEndian32
                        (in_stack_fffffffffffffb98,(uint32 *)in_stack_fffffffffffffb90);
      if (!bVar1) {
        return false;
      }
      WireFormatLite::DecodeFloat(local_e4);
      if ((in_RCX[1] & 1) == 0) {
        SetFloat((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,in_stack_fffffffffffffc94,
                 in_stack_fffffffffffffc88);
      }
      else {
        AddFloat(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0x2:
      bVar1 = io::CodedInputStream::ReadVarint64
                        (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
      if (!bVar1) {
        return false;
      }
      if ((in_RCX[1] & 1) == 0) {
        SetInt64((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                 CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 in_stack_fffffffffffffc88);
      }
      else {
        AddInt64(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0x3:
      bVar1 = io::CodedInputStream::ReadVarint64
                        (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
      if (!bVar1) {
        return false;
      }
      if ((in_RCX[1] & 1) == 0) {
        SetUInt64((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                  in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                  CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                  in_stack_fffffffffffffc88);
      }
      else {
        AddUInt64(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),
                  CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                  in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0x4:
      bVar1 = io::CodedInputStream::ReadVarint32(pCVar5,(uint32 *)in_stack_fffffffffffffba0);
      if (!bVar1) {
        return false;
      }
      if ((in_RCX[1] & 1) == 0) {
        SetInt32((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                 (int32)in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
      }
      else {
        AddInt32(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),(int32)in_stack_fffffffffffffd0c,
                 in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0x5:
      bVar1 = io::CodedInputStream::ReadLittleEndian64
                        (in_stack_fffffffffffffb98,(uint64 *)in_stack_fffffffffffffb90);
      if (!bVar1) {
        return false;
      }
      if ((in_RCX[1] & 1) == 0) {
        SetUInt64((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                  in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                  CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                  in_stack_fffffffffffffc88);
      }
      else {
        AddUInt64(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),
                  CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                  in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0x6:
      bVar1 = io::CodedInputStream::ReadLittleEndian32
                        (in_stack_fffffffffffffb98,(uint32 *)in_stack_fffffffffffffb90);
      if (!bVar1) {
        return false;
      }
      if ((in_RCX[1] & 1) == 0) {
        SetUInt32((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                  in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                  (uint32)in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
      }
      else {
        AddUInt32(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),(uint32)in_stack_fffffffffffffd0c,
                  in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0x7:
      bVar1 = io::CodedInputStream::ReadVarint64
                        (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
      if (!bVar1) {
        return false;
      }
      if ((in_RCX[1] & 1) == 0) {
        SetBool((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,(bool)in_stack_fffffffffffffc9a,
                (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      }
      else {
        AddBool(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                SUB81((ulong)in_R9 >> 0x10,0),SUB81((ulong)in_R9 >> 8,0),
                (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      }
      break;
    case (CodedInputStream *)0x8:
      if ((in_RCX[1] & 1) == 0) {
        MutableString_abi_cxx11_
                  ((ExtensionSet *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   in_stack_fffffffffffffcbc,type_00,in_stack_fffffffffffffcb0);
      }
      else {
        AddString_abi_cxx11_
                  (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4,type_01,
                   (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8))
        ;
      }
      bVar1 = WireFormatLite::ReadString
                        (in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88);
      if (!bVar1) {
        return false;
      }
      break;
    case (CodedInputStream *)0x9:
      if ((in_RCX[1] & 1) == 0) {
        value_32 = MutableMessage(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,type,
                                  (MessageLite *)
                                  CONCAT44(in_stack_fffffffffffffc9c,
                                           CONCAT13(in_stack_fffffffffffffc9b,
                                                    CONCAT12(in_stack_fffffffffffffc9a,
                                                             in_stack_fffffffffffffc98))),
                                  (FieldDescriptor *)
                                  CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
        iVar3 = (int)in_stack_fffffffffffffba0;
      }
      else {
        value_32 = AddMessage(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
                              in_stack_fffffffffffffcd3,(MessageLite *)in_stack_fffffffffffffcc8,
                              (FieldDescriptor *)
                              CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        iVar3 = (int)in_stack_fffffffffffffba0;
      }
      bVar1 = WireFormatLite::ReadGroup<google::protobuf::MessageLite>
                        (iVar3,in_stack_fffffffffffffb98,value_32);
      if (!bVar1) {
        return false;
      }
      break;
    case (CodedInputStream *)0xa:
      if ((in_RCX[1] & 1) == 0) {
        MutableMessage(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,type,
                       (MessageLite *)
                       CONCAT44(in_stack_fffffffffffffc9c,
                                CONCAT13(in_stack_fffffffffffffc9b,
                                         CONCAT12(in_stack_fffffffffffffc9a,
                                                  in_stack_fffffffffffffc98))),
                       (FieldDescriptor *)
                       CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      }
      else {
        AddMessage(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd3,
                   (MessageLite *)in_stack_fffffffffffffcc8,
                   (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0))
        ;
      }
      bVar1 = WireFormatLite::ReadMessage<google::protobuf::MessageLite>
                        (in_stack_fffffffffffffb98,(MessageLite *)in_stack_fffffffffffffb90);
      if (!bVar1) {
        return false;
      }
      break;
    case (CodedInputStream *)0xb:
      if ((in_RCX[1] & 1) == 0) {
        pCVar5 = (CodedInputStream *)
                 MutableString_abi_cxx11_
                           ((ExtensionSet *)
                            CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                            in_stack_fffffffffffffcbc,type_00,in_stack_fffffffffffffcb0);
      }
      else {
        pCVar5 = (CodedInputStream *)
                 AddString_abi_cxx11_
                           (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4,type_01,
                            (FieldDescriptor *)
                            CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      }
      bVar1 = WireFormatLite::ReadBytes(pCVar5,(string *)in_stack_fffffffffffffb90);
      if (!bVar1) {
        return false;
      }
      break;
    case (CodedInputStream *)0xc:
      bVar1 = io::CodedInputStream::ReadVarint32(pCVar5,(uint32 *)in_stack_fffffffffffffba0);
      if (!bVar1) {
        return false;
      }
      if ((in_RCX[1] & 1) == 0) {
        SetUInt32((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                  in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                  (uint32)in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
      }
      else {
        AddUInt32(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),(uint32)in_stack_fffffffffffffd0c,
                  in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0xd:
      bVar1 = io::CodedInputStream::ReadVarint32(pCVar5,(uint32 *)in_stack_fffffffffffffba0);
      if (!bVar1) {
        return false;
      }
      uVar4 = (**(code **)(in_RCX + 8))(*(undefined8 *)(in_RCX + 0x10),local_34);
      if ((uVar4 & 1) == 0) {
        (**(code **)(*in_R9 + 0x20))(in_R9,in_ESI,local_34);
      }
      else if ((in_RCX[1] & 1) == 0) {
        SetEnum((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,(int)in_stack_fffffffffffffc94,
                in_stack_fffffffffffffc88);
      }
      else {
        AddEnum(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                SUB81((ulong)in_R9 >> 0x10,0),(int)in_stack_fffffffffffffd0c,
                in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0xe:
      bVar1 = io::CodedInputStream::ReadLittleEndian32
                        (in_stack_fffffffffffffb98,(uint32 *)in_stack_fffffffffffffb90);
      if (!bVar1) {
        return false;
      }
      if ((in_RCX[1] & 1) == 0) {
        SetInt32((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                 (int32)in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
      }
      else {
        AddInt32(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),(int32)in_stack_fffffffffffffd0c,
                 in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0xf:
      bVar1 = io::CodedInputStream::ReadLittleEndian64
                        (in_stack_fffffffffffffb98,(uint64 *)in_stack_fffffffffffffb90);
      if (!bVar1) {
        return false;
      }
      if ((in_RCX[1] & 1) == 0) {
        SetInt64((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                 CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 in_stack_fffffffffffffc88);
      }
      else {
        AddInt64(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0x10:
      bVar1 = io::CodedInputStream::ReadVarint32(pCVar5,(uint32 *)in_stack_fffffffffffffba0);
      if (!bVar1) {
        return false;
      }
      WireFormatLite::ZigZagDecode32(local_20c);
      if ((in_RCX[1] & 1) == 0) {
        SetInt32((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                 (int32)in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
      }
      else {
        AddInt32(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),(int32)in_stack_fffffffffffffd0c,
                 in_stack_fffffffffffffd00);
      }
      break;
    case (CodedInputStream *)0x11:
      bVar1 = io::CodedInputStream::ReadVarint64
                        (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
      if (!bVar1) {
        return false;
      }
      WireFormatLite::ZigZagDecode64(local_1d8);
      if ((in_RCX[1] & 1) == 0) {
        SetInt64((ExtensionSet *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c,in_stack_fffffffffffffc9b,
                 CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 in_stack_fffffffffffffc88);
      }
      else {
        AddInt64(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd00);
      }
    }
  }
  else {
    bVar1 = io::CodedInputStream::ReadVarint32
                      (in_stack_fffffffffffffba8,(uint32 *)in_stack_fffffffffffffba0);
    if (!bVar1) {
      return false;
    }
    LVar2 = io::CodedInputStream::PushLimit
                      (in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    switch(*in_RCX) {
    case 1:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadLittleEndian64
                          (in_stack_fffffffffffffb98,(uint64 *)in_stack_fffffffffffffb90);
        if (!bVar1) {
          return false;
        }
        WireFormatLite::DecodeDouble(local_90);
        AddDouble(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),(double)CONCAT44(in_stack_fffffffffffffd0c,LVar2),
                  in_stack_fffffffffffffd00);
      }
      break;
    case 2:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadLittleEndian32
                          (in_stack_fffffffffffffb98,(uint32 *)in_stack_fffffffffffffb90);
        if (!bVar1) {
          return false;
        }
        WireFormatLite::DecodeFloat(local_cc);
        AddFloat(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00);
      }
      break;
    case 3:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadVarint64
                          (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        if (!bVar1) {
          return false;
        }
        AddInt64(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),CONCAT44(in_stack_fffffffffffffd0c,LVar2),
                 in_stack_fffffffffffffd00);
      }
      break;
    case 4:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadVarint64
                          (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        if (!bVar1) {
          return false;
        }
        AddUInt64(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),CONCAT44(in_stack_fffffffffffffd0c,LVar2),
                  in_stack_fffffffffffffd00);
      }
      break;
    case 5:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadVarint32
                          (in_stack_fffffffffffffba8,(uint32 *)in_stack_fffffffffffffba0);
        if (!bVar1) {
          return false;
        }
        AddInt32(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),(int32)in_stack_fffffffffffffd0c,
                 in_stack_fffffffffffffd00);
      }
      break;
    case 6:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadLittleEndian64
                          (in_stack_fffffffffffffb98,(uint64 *)in_stack_fffffffffffffb90);
        if (!bVar1) {
          return false;
        }
        AddUInt64(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),CONCAT44(in_stack_fffffffffffffd0c,LVar2),
                  in_stack_fffffffffffffd00);
      }
      break;
    case 7:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadLittleEndian32
                          (in_stack_fffffffffffffb98,(uint32 *)in_stack_fffffffffffffb90);
        if (!bVar1) {
          return false;
        }
        AddUInt32(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),(uint32)in_stack_fffffffffffffd0c,
                  in_stack_fffffffffffffd00);
      }
      break;
    case 8:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadVarint64
                          (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        if (!bVar1) {
          return false;
        }
        AddBool(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                SUB81((ulong)in_R9 >> 0x10,0),SUB81((ulong)in_R9 >> 8,0),
                (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd0c,LVar2));
      }
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffba0,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                 (char *)in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
      LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      LogMessage::~LogMessage((LogMessage *)0x47beaa);
      break;
    case 0xd:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadVarint32
                          (in_stack_fffffffffffffba8,(uint32 *)in_stack_fffffffffffffba0);
        if (!bVar1) {
          return false;
        }
        AddUInt32(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),(uint32)in_stack_fffffffffffffd0c,
                  in_stack_fffffffffffffd00);
      }
      break;
    case 0xe:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadVarint32
                          (in_stack_fffffffffffffba8,(uint32 *)in_stack_fffffffffffffba0);
        if (!bVar1) {
          return false;
        }
        uVar6 = local_1c;
        uVar4 = (**(code **)(in_RCX + 8))(*(undefined8 *)(in_RCX + 0x10),local_1c);
        if ((uVar4 & 1) == 0) {
          (**(code **)(*in_R9 + 0x20))(in_R9,in_ESI,uVar6);
        }
        else {
          AddEnum(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                  SUB81((ulong)in_R9 >> 0x10,0),(int)in_stack_fffffffffffffd0c,
                  in_stack_fffffffffffffd00);
        }
      }
      break;
    case 0xf:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadLittleEndian32
                          (in_stack_fffffffffffffb98,(uint32 *)in_stack_fffffffffffffb90);
        if (!bVar1) {
          return false;
        }
        AddInt32(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),(int32)in_stack_fffffffffffffd0c,
                 in_stack_fffffffffffffd00);
      }
      break;
    case 0x10:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadLittleEndian64
                          (in_stack_fffffffffffffb98,(uint64 *)in_stack_fffffffffffffb90);
        if (!bVar1) {
          return false;
        }
        AddInt64(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),CONCAT44(in_stack_fffffffffffffd0c,LVar2),
                 in_stack_fffffffffffffd00);
      }
      break;
    case 0x11:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadVarint32
                          (in_stack_fffffffffffffba8,(uint32 *)in_stack_fffffffffffffba0);
        if (!bVar1) {
          return false;
        }
        WireFormatLite::ZigZagDecode32(local_1f4);
        AddInt32(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),(int32)in_stack_fffffffffffffd0c,
                 in_stack_fffffffffffffd00);
      }
      break;
    case 0x12:
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_stack_fffffffffffffb98), 0 < iVar3) {
        bVar1 = io::CodedInputStream::ReadVarint64
                          (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        if (!bVar1) {
          return false;
        }
        WireFormatLite::ZigZagDecode64(local_1b8);
        AddInt64(in_R8,(int)((ulong)in_R9 >> 0x20),(FieldType)((ulong)in_R9 >> 0x18),
                 SUB81((ulong)in_R9 >> 0x10,0),CONCAT44(in_stack_fffffffffffffd0c,LVar2),
                 in_stack_fffffffffffffd00);
      }
    }
    io::CodedInputStream::PopLimit
              (in_stack_fffffffffffffb90,(Limit)((ulong)in_stack_fffffffffffffb88 >> 0x20));
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(int number,
                                               bool was_packed_on_wire,
                                               const ExtensionInfo& extension,
                                               io::CodedInputStream* input,
                                               FieldSkipper* field_skipper) {
  // Explicitly not read extension.is_packed, instead check whether the field
  // was encoded in packed form on the wire.
  if (was_packed_on_wire) {
    uint32 size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    while (input->BytesUntilLimit() > 0) {                                  \
      CPP_LOWERCASE value;                                                  \
      if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                     \
                                         WireFormatLite::TYPE_##UPPERCASE>( \
              input, &value))                                               \
        return false;                                                       \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    }                                                                       \
    break

      HANDLE_TYPE(INT32, Int32, int32);
      HANDLE_TYPE(INT64, Int64, int64);
      HANDLE_TYPE(UINT32, UInt32, uint32);
      HANDLE_TYPE(UINT64, UInt64, uint64);
      HANDLE_TYPE(SINT32, Int32, int32);
      HANDLE_TYPE(SINT64, Int64, int64);
      HANDLE_TYPE(FIXED32, UInt32, uint32);
      HANDLE_TYPE(FIXED64, UInt64, uint64);
      HANDLE_TYPE(SFIXED32, Int32, int32);
      HANDLE_TYPE(SFIXED64, Int64, int64);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed,
                    value, extension.descriptor);
          } else {
            // Invalid value.  Treat as unknown.
            field_skipper->SkipUnknownEnum(number, value);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    CPP_LOWERCASE value;                                                    \
    if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                       \
                                       WireFormatLite::TYPE_##UPPERCASE>(   \
            input, &value))                                                 \
      return false;                                                         \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_TYPE(INT32, Int32, int32);
      HANDLE_TYPE(INT64, Int64, int64);
      HANDLE_TYPE(UINT32, UInt32, uint32);
      HANDLE_TYPE(UINT64, UInt64, uint64);
      HANDLE_TYPE(SINT32, Int32, int32);
      HANDLE_TYPE(SINT64, Int64, int64);
      HANDLE_TYPE(FIXED32, UInt32, uint32);
      HANDLE_TYPE(FIXED64, UInt64, uint64);
      HANDLE_TYPE(SFIXED32, Int32, int32);
      HANDLE_TYPE(SFIXED64, Int64, int64);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_BYTES,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_BYTES,
                                extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}